

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool testing::internal::ParseFlag(char *str,char *flag_name,int32_t *value)

{
  bool bVar1;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *in_RAX;
  char *str_00;
  size_t sVar2;
  pointer *__ptr;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  
  bVar1 = false;
  local_38._M_head_impl = in_RAX;
  str_00 = ParseFlagValue(str,flag_name,false);
  if (str_00 != (char *)0x0) {
    Message::Message((Message *)&local_38);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_38._M_head_impl + 0x10),"The value of flag --",0x14);
    if (flag_name == (char *)0x0) {
      sVar2 = 6;
      flag_name = "(null)";
    }
    else {
      sVar2 = strlen(flag_name);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_38._M_head_impl + 0x10),flag_name,sVar2);
    bVar1 = ParseInt32((Message *)&local_38,str_00,value);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))(local_38._M_head_impl);
    }
  }
  return bVar1;
}

Assistant:

bool ParseFlag(const char* str, const char* flag_name, int32_t* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag_name, false);

  // Aborts if the parsing failed.
  if (value_str == nullptr) return false;

  // Sets *value to the value of the flag.
  return ParseInt32(Message() << "The value of flag --" << flag_name, value_str,
                    value);
}